

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

string * __thiscall
leveldb::Status::ToString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  char **ppcVar1;
  Code CVar2;
  allocator local_42;
  undefined1 local_41;
  uint32_t length;
  char *type;
  char tmp [30];
  Status *this_local;
  string *result;
  
  unique0x10000152 = this;
  if (this->state_ == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OK",(allocator *)(tmp + 0x17));
    std::allocator<char>::~allocator((allocator<char> *)(tmp + 0x17));
  }
  else {
    CVar2 = code(this);
    switch(CVar2) {
    case kOk:
      _length = "OK";
      break;
    case kNotFound:
      _length = "NotFound: ";
      break;
    case kCorruption:
      _length = "Corruption: ";
      break;
    case kNotSupported:
      _length = "Not implemented: ";
      break;
    case kInvalidArgument:
      _length = "Invalid argument: ";
      break;
    case kIOError:
      _length = "IO error: ";
      break;
    default:
      CVar2 = code(this);
      snprintf((char *)&type,0x1e,"Unknown code(%d): ",(ulong)CVar2);
      _length = (char *)&type;
    }
    ppcVar1 = (char **)_length;
    local_41 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)ppcVar1,&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->state_ + 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        std::snprintf(tmp, sizeof(tmp),
                      "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    std::memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}